

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O3

Ptr __thiscall
TgBot::TgTypeParser::parseJsonAndGetInlineQueryResultLocation(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  self_type *psVar2;
  optional<int> oVar3;
  long *plVar4;
  int iVar5;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  dummy_u *pdVar7;
  type_conflict3 tVar8;
  Ptr PVar9;
  path_type local_d0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  TgTypeParser *local_58;
  dummy_u local_50;
  
  *(undefined8 *)this = 0;
  local_58 = this + 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TgBot::InlineQueryResultLocation,std::allocator<TgBot::InlineQueryResultLocation>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_58,
             (InlineQueryResultLocation **)this,
             (allocator<TgBot::InlineQueryResultLocation> *)&local_d0);
  paVar1 = &local_d0.m_value.field_2;
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"latitude","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  psVar2 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_d0);
  std::locale::locale((locale *)local_78);
  std::locale::locale((locale *)&local_a0,(locale *)local_78);
  tVar8 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<float,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,float>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar2,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_float> *
                     )&local_a0);
  std::locale::~locale((locale *)&local_a0);
  std::locale::~locale((locale *)local_78);
  *(type_conflict3 *)(*(long *)this + 0xa8) = tVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"longitude","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  psVar2 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_d0);
  std::locale::locale((locale *)local_78);
  std::locale::locale((locale *)&local_a0,(locale *)local_78);
  tVar8 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<float,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,float>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar2,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_float> *
                     )&local_a0);
  std::locale::~locale((locale *)&local_a0);
  std::locale::~locale((locale *)local_78);
  *(type_conflict3 *)(*(long *)this + 0xac) = tVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"thumb_url","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  local_50.aligner_ = (type)((long)local_50.data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            (&local_a0,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_d0);
  pdVar7 = &local_50;
  if ((locale)local_a0.super_type.m_initialized != (locale)0x0) {
    pdVar7 = &local_a0.super_type.m_storage.dummy_;
  }
  local_78[0] = local_68;
  plVar4 = (long *)(local_50.data + 8);
  if ((locale)local_a0.super_type.m_initialized != (locale)0x0) {
    plVar4 = (long *)((long)&local_a0.super_type.m_storage.dummy_ + 8);
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pdVar7->aligner_,*plVar4 + (long)pdVar7->aligner_);
  if (((locale)local_a0.super_type.m_initialized == (locale)0x1) &&
     (local_a0.super_type.m_storage.dummy_.aligner_ !=
      (type)((long)&local_a0.super_type.m_storage.dummy_ + 0x10U))) {
    operator_delete((void *)local_a0.super_type.m_storage.dummy_.aligner_);
  }
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xb0),(string *)local_78);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if (local_50.aligner_ != (type)((long)local_50.data + 0x10)) {
    operator_delete((void *)local_50.aligner_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"thumb_width","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  oVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_d0);
  iVar5 = 0;
  if (((ulong)oVar3.super_type & 1) != 0) {
    iVar5 = oVar3.super_type.m_storage;
  }
  *(int *)(*(long *)this + 0xd0) = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"thumb_height","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  oVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_d0);
  _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (((ulong)oVar3.super_type & 1) != 0) {
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)oVar3.super_type >> 0x20);
  }
  *(int *)(*(long *)this + 0xd4) = (int)_Var6._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
    _Var6._M_pi = extraout_RDX;
  }
  PVar9.super___shared_ptr<TgBot::InlineQueryResultLocation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var6._M_pi;
  PVar9.super___shared_ptr<TgBot::InlineQueryResultLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar9.super___shared_ptr<TgBot::InlineQueryResultLocation,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

InlineQueryResultLocation::Ptr TgTypeParser::parseJsonAndGetInlineQueryResultLocation(const boost::property_tree::ptree& data) const {
    // NOTE: This function will be called by parseJsonAndGgetInlineQueryResult().
    auto result(make_shared<InlineQueryResultLocation>());
    result->latitude = data.get<float>("latitude");
    result->longitude = data.get<float>("longitude");
    result->thumbUrl = data.get<string>("thumb_url", "");
    result->thumbWidth = data.get<int32_t>("thumb_width", 0);
    result->thumbHeight = data.get<int32_t>("thumb_height", 0);
    return result;
}